

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

int __thiscall
glcts::TessellationShaderTCTETests::init(TessellationShaderTCTETests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TessellationShaderTCTEDataPassThrough *this_00;
  TessellationShaderTCTEgl_in *this_01;
  TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this_02;
  TessellationShaderTCTEgl_PatchVerticesIn *this_03;
  TessellationShaderTCTEgl_TessLevel *this_04;
  
  this_00 = (TessellationShaderTCTEDataPassThrough *)operator_new(0x2e0);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  TessellationShaderTCTEDataPassThrough::TessellationShaderTCTEDataPassThrough
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TessellationShaderTCTEgl_in *)operator_new(0x2d0);
  TessellationShaderTCTEgl_in::TessellationShaderTCTEgl_in
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *)operator_new(0x2e8);
  TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::
  TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize
            (this_02,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (TessellationShaderTCTEgl_PatchVerticesIn *)operator_new(0x2d8);
  TessellationShaderTCTEgl_PatchVerticesIn::TessellationShaderTCTEgl_PatchVerticesIn
            (this_03,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (TessellationShaderTCTEgl_TessLevel *)operator_new(0x2d8);
  TessellationShaderTCTEgl_TessLevel::TessellationShaderTCTEgl_TessLevel
            (this_04,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  return extraout_EAX;
}

Assistant:

void TessellationShaderTCTETests::init(void)
{
	addChild(new glcts::TessellationShaderTCTEDataPassThrough(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTCTEgl_in(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTCTEgl_PatchVerticesIn(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTCTEgl_TessLevel(m_context, m_extParams));
}